

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CLIViewController.cpp
# Opt level: O0

bool __thiscall CLIViewController::parseControl(CLIViewController *this,char key)

{
  bool bVar1;
  char key_local;
  CLIViewController *this_local;
  
  if ((((key == this->KEYBOARD_ARROW_UP_WIN) || (key == this->KEYBOARD_ARROW_UP_MAC)) ||
      (key == 'w')) || (key == 'W')) {
    SW2048Game::move(this->game,Vector2::DOWN);
  }
  else if (((key == this->KEYBOARD_ARROW_DOWN_WIN) || (key == this->KEYBOARD_ARROW_DOWN_MAC)) ||
          ((key == 's' || (key == 'S')))) {
    SW2048Game::move(this->game,Vector2::UP);
  }
  else if (((key == this->KEYBOARD_ARROW_LEFT_WIN) || (key == this->KEYBOARD_ARROW_LEFT_MAC)) ||
          ((key == 'a' || (key == 'A')))) {
    bVar1 = SW2048Game::isPlaying(this->game);
    if (bVar1) {
      SW2048Game::move(this->game,Vector2::LEFT);
    }
    else {
      SW2048Game::restart(this->game);
    }
  }
  else {
    if ((((key != this->KEYBOARD_ARROW_RIGHT_WIN) && (key != this->KEYBOARD_ARROW_RIGHT_MAC)) &&
        (key != 'd')) && (key != 'D')) {
      return false;
    }
    bVar1 = SW2048Game::isPlaying(this->game);
    if (!bVar1) {
      exit(0);
    }
    SW2048Game::move(this->game,Vector2::RIGHT);
  }
  return true;
}

Assistant:

bool CLIViewController::parseControl(char key)
{
	if (key == CLIViewController::KEYBOARD_ARROW_UP_WIN
	 || key == CLIViewController::KEYBOARD_ARROW_UP_MAC
	 || key == 'w' || key == 'W')
		game->move(Vector2::DOWN);
	else if (key == CLIViewController::KEYBOARD_ARROW_DOWN_WIN
		  || key == CLIViewController::KEYBOARD_ARROW_DOWN_MAC
		  || key == 's' || key == 'S')
		game->move(Vector2::UP);
	else if (key == CLIViewController::KEYBOARD_ARROW_LEFT_WIN
		  || key == CLIViewController::KEYBOARD_ARROW_LEFT_MAC
		  || key == 'a' || key == 'A')
		if (game->isPlaying())
			game->move(Vector2::LEFT);
		else
			game->restart();
	else if (key == CLIViewController::KEYBOARD_ARROW_RIGHT_WIN
		  || key == CLIViewController::KEYBOARD_ARROW_RIGHT_MAC
		  || key == 'd' || key == 'D')
		if (game->isPlaying())
			game->move(Vector2::RIGHT);
		else
			std::exit(EXIT_SUCCESS);
	else
		return false;
	return true;
}